

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void phosg::make_fd_nonblocking(int fd)

{
  int iVar1;
  runtime_error *prVar2;
  uint *puVar3;
  int error;
  int error_00;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  uint local_10;
  int local_c;
  int flags;
  int fd_local;
  
  local_c = fd;
  local_10 = fcntl(fd,3,0);
  if ((int)local_10 < 0) {
    local_5d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar3 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_50,(phosg *)(ulong)*puVar3,error);
    ::std::operator+(&local_30,"can\'t get socket flags: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
    ;
    ::std::runtime_error::runtime_error(prVar2,(string *)&local_30);
    local_5d = 0;
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = fcntl(local_c,4,(ulong)(local_10 | 0x800));
  if (iVar1 < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar3 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_a0,(phosg *)(ulong)*puVar3,error_00);
    ::std::operator+(&local_80,"can\'t set socket flags: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0)
    ;
    ::std::runtime_error::runtime_error(prVar2,(string *)&local_80);
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void make_fd_nonblocking(int fd) {
  int flags = fcntl(fd, F_GETFL, 0);
  if (flags < 0) {
    throw runtime_error("can\'t get socket flags: " + string_for_error(errno));
  }
  if (fcntl(fd, F_SETFL, flags | O_NONBLOCK) < 0) {
    throw runtime_error("can\'t set socket flags: " + string_for_error(errno));
  }
}